

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkPowerdown(Abc_Ntk_t *pNtk,int fUseLutLib,int Percentage,int Degree,int fVerbose,
                int fVeryVerbose)

{
  float fVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  Abc_Obj_t *pNode;
  void *pvVar4;
  undefined8 *puVar5;
  Abc_NtkType_t AVar6;
  Vec_Int_t *vProbs;
  void *__ptr;
  Abc_Ntk_t *pAig;
  Vec_Ptr_t *vTimes;
  void **ppvVar7;
  Abc_Ntk_t *vLeaves;
  void **ppvVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  void *pvVar14;
  void *pvVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  Abc_Ntk_t *pNtk_00;
  char *pcVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  float *pProb;
  long lVar24;
  float fVar25;
  int local_90;
  ulong local_88;
  ulong local_70;
  ulong local_48;
  
  vProbs = Abc_NtkPowerEstimate(pNtk,0);
  pAVar2 = (Abc_Ntk_t *)vProbs->pArray;
  if (fVerbose != 0) {
    Abc_NtkPowerPrint(pNtk,vProbs);
  }
  pVVar10 = pNtk->vObjs;
  lVar24 = (long)pVVar10->nSize;
  __ptr = calloc(1,lVar24 * 4);
  if (0 < lVar24) {
    fVar25 = (float)Percentage / -100.0 + 0.5;
    ppvVar7 = pVVar10->pArray;
    lVar17 = 0;
    do {
      plVar3 = (long *)ppvVar7[lVar17];
      if (((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
         (fVar25 < (float)pAVar2->nObjCounts[(long)(int)plVar3[2] + -0x18] ||
          fVar25 == (float)pAVar2->nObjCounts[(long)(int)plVar3[2] + -0x18])) {
        if ((long)*(int *)((long)plVar3 + 0x1c) < 1) {
          uVar22 = 0;
        }
        else {
          lVar12 = 0;
          uVar22 = 0;
          do {
            uVar16 = 1 << ((byte)lVar12 & 0x1f);
            if ((float)pAVar2->nObjCounts
                       [(long)*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                (long)*(int *)(plVar3[4] + lVar12 * 4) * 8) + 0x10)
                        + -0x18] < fVar25) {
              uVar16 = 0;
            }
            uVar22 = uVar22 | uVar16;
            lVar12 = lVar12 + 1;
          } while (*(int *)((long)plVar3 + 0x1c) != lVar12);
        }
        *(uint *)((long)__ptr + (long)(int)plVar3[2] * 4) = uVar22;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar24);
  }
  pAig = Abc_NtkStrash(pNtk,0,1,0);
  vTimes = (Vec_Ptr_t *)malloc(0x10);
  vTimes->nCap = 0x10;
  ppvVar7 = (void **)malloc(0x80);
  vTimes->pArray = ppvVar7;
  vLeaves = (Abc_Ntk_t *)malloc(0x10);
  local_88 = 0x10;
  vLeaves->ntkType = 0x10;
  ppvVar8 = (void **)malloc(0x80);
  vLeaves->pName = (char *)ppvVar8;
  pVVar10 = pNtk->vObjs;
  if (pVVar10->nSize < 1) {
    uVar9 = 0;
    local_90 = 0;
  }
  else {
    local_70 = 0x10;
    local_48 = 0x10;
    lVar24 = 0;
    local_90 = 0;
    uVar22 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar10->pArray[lVar24];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        iVar20 = (pNode->vFanins).nSize;
        uVar9 = (ulong)iVar20;
        if ((long)uVar9 < 1) {
          uVar16 = 0;
        }
        else {
          uVar18 = 0;
          uVar16 = 0;
          do {
            uVar23 = *(uint *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar18]] +
                              0x14) & 0xf;
            if ((uVar23 != 2) && (uVar23 != 5)) {
              uVar16 = uVar16 + ((*(uint *)((long)__ptr + (long)pNode->Id * 4) >>
                                  ((uint)uVar18 & 0x1f) & 1) != 0);
            }
            uVar18 = uVar18 + 1;
          } while (uVar9 != uVar18);
        }
        if (fVeryVerbose != 0 || uVar16 != 0) {
          uVar22 = uVar22 + 1;
          vTimes->nSize = 0;
          if ((uVar16 != 0) && (0 < iVar20)) {
            uVar23 = 0;
            lVar17 = 0;
            do {
              plVar3 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar17]];
              uVar11 = *(uint *)((long)plVar3 + 0x14) & 0xf;
              if ((((uVar11 != 2) && (uVar11 != 5)) &&
                  ((*(uint *)((long)__ptr + (long)pNode->Id * 4) >> ((uint)lVar17 & 0x1f) & 1) != 0)
                  ) && (iVar20 = *(int *)((long)plVar3 + 0x1c), 0 < iVar20)) {
                lVar12 = 0;
                do {
                  if ((*(uint *)((long)__ptr + (long)(int)plVar3[2] * 4) >> ((uint)lVar12 & 0x1f) &
                      1) != 0) {
                    pvVar4 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                       (long)*(int *)(plVar3[4] + lVar12 * 4) * 8);
                    if (0 < (int)uVar23) {
                      uVar9 = 0;
                      do {
                        if (vTimes->pArray[uVar9] == pvVar4) goto LAB_00314270;
                        uVar9 = uVar9 + 1;
                      } while (uVar23 != uVar9);
                    }
                    uVar11 = (uint)local_48;
                    if (uVar23 == uVar11) {
                      if ((int)uVar11 < 0x10) {
                        if (vTimes->pArray == (void **)0x0) {
                          ppvVar7 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar7 = (void **)realloc(vTimes->pArray,0x80);
                        }
                        vTimes->pArray = ppvVar7;
                        vTimes->nCap = 0x10;
                        local_48 = 0x10;
                      }
                      else {
                        local_48 = (ulong)(uVar11 * 2);
                        if (vTimes->pArray == (void **)0x0) {
                          ppvVar7 = (void **)malloc(local_48 * 8);
                        }
                        else {
                          ppvVar7 = (void **)realloc(vTimes->pArray,local_48 * 8);
                        }
                        vTimes->pArray = ppvVar7;
                        vTimes->nCap = uVar11 * 2;
                      }
                    }
                    else {
                      ppvVar7 = vTimes->pArray;
                    }
                    lVar13 = (long)(int)uVar23;
                    uVar23 = uVar23 + 1;
                    vTimes->nSize = uVar23;
                    ppvVar7[lVar13] = pvVar4;
                    iVar20 = *(int *)((long)plVar3 + 0x1c);
                  }
LAB_00314270:
                  lVar12 = lVar12 + 1;
                } while (lVar12 < iVar20);
                uVar9 = (ulong)(uint)(pNode->vFanins).nSize;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)uVar9);
            if ((int)uVar23 <= Degree && uVar23 != 0) {
              vLeaves->ntkFunc = ABC_FUNC_NONE;
              uVar18 = 0;
              if (0 < (int)uVar9) {
                lVar17 = 0;
                do {
                  plVar3 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar17]];
                  uVar11 = *(uint *)((long)plVar3 + 0x14) & 0xf;
                  if ((uVar11 == 2) || (uVar11 == 5)) {
                    iVar20 = (int)uVar18;
                    if (0 < iVar20) {
                      uVar9 = 0;
                      do {
                        if (*(long **)((long)vLeaves->pName + uVar9 * 8) == plVar3)
                        goto LAB_003144ce;
                        uVar9 = uVar9 + 1;
                      } while (uVar18 != uVar9);
                    }
                    iVar21 = (int)local_70;
                    if (iVar20 == iVar21) {
                      if (iVar21 < 0x10) {
                        if ((void **)vLeaves->pName == (void **)0x0) {
                          ppvVar7 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar7 = (void **)realloc(vLeaves->pName,0x80);
                        }
                        vLeaves->pName = (char *)ppvVar7;
                        vLeaves->ntkType = 0x10;
                        local_88 = 0x10;
                        local_70 = 0x10;
                      }
                      else {
                        AVar6 = iVar21 * 2;
                        local_70 = (ulong)AVar6;
                        if ((void **)vLeaves->pName == (void **)0x0) {
                          ppvVar7 = (void **)malloc(local_70 * 8);
                        }
                        else {
                          ppvVar7 = (void **)realloc(vLeaves->pName,local_70 * 8);
                        }
                        vLeaves->pName = (char *)ppvVar7;
                        vLeaves->ntkType = AVar6;
                        local_88 = (ulong)AVar6;
                      }
                    }
                    else {
                      ppvVar7 = (void **)vLeaves->pName;
                    }
                    vLeaves->ntkFunc = iVar20 + ABC_FUNC_SOP;
                    ppvVar7[iVar20] = plVar3;
                    uVar18 = (ulong)(iVar20 + ABC_FUNC_SOP);
                  }
                  else {
                    iVar20 = *(int *)((long)plVar3 + 0x1c);
                    if (0 < iVar20) {
                      lVar12 = 0;
                      do {
                        pvVar4 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                           (long)*(int *)(plVar3[4] + lVar12 * 4) * 8);
                        iVar21 = (int)uVar18;
                        if (0 < iVar21) {
                          uVar9 = 0;
                          do {
                            if (*(void **)((long)vLeaves->pName + uVar9 * 8) == pvVar4)
                            goto LAB_0031443e;
                            uVar9 = uVar9 + 1;
                          } while (uVar18 != uVar9);
                        }
                        iVar20 = (int)local_88;
                        if (iVar21 == iVar20) {
                          if (iVar20 < 0x10) {
                            if ((void **)vLeaves->pName == (void **)0x0) {
                              ppvVar7 = (void **)malloc(0x80);
                            }
                            else {
                              ppvVar7 = (void **)realloc(vLeaves->pName,0x80);
                            }
                            vLeaves->pName = (char *)ppvVar7;
                            vLeaves->ntkType = 0x10;
                            local_88 = 0x10;
                          }
                          else {
                            local_88 = (ulong)(uint)(iVar20 * 2);
                            if ((void **)vLeaves->pName == (void **)0x0) {
                              ppvVar7 = (void **)malloc(local_88 * 8);
                            }
                            else {
                              ppvVar7 = (void **)realloc(vLeaves->pName,local_88 * 8);
                            }
                            vLeaves->pName = (char *)ppvVar7;
                            vLeaves->ntkType = iVar20 * 2;
                          }
                        }
                        else {
                          ppvVar7 = (void **)vLeaves->pName;
                        }
                        uVar18 = (ulong)(iVar21 + 1);
                        ppvVar7[iVar21] = pvVar4;
                        iVar20 = *(int *)((long)plVar3 + 0x1c);
                        local_70 = local_88;
LAB_0031443e:
                        lVar12 = lVar12 + 1;
                      } while (lVar12 < iVar20);
                      vLeaves->ntkFunc = (Abc_NtkFunc_t)uVar18;
                    }
                  }
LAB_003144ce:
                  lVar17 = lVar17 + 1;
                } while (lVar17 < (pNode->vFanins).nSize);
              }
              pNtk_00 = vLeaves;
              if (fVeryVerbose != 0) {
                printf("%5d Node %5d : %d %2d %2d  ",(ulong)uVar22,(ulong)(uint)pNode->Id,
                       (ulong)uVar16,(ulong)uVar23,uVar18);
                if (0 < (pNode->vFanins).nSize) {
                  lVar17 = 0;
                  do {
                    lVar12 = (long)*(int *)((long)pNode->pNtk->vObjs->pArray
                                                  [(pNode->vFanins).pArray[lVar17]] + 0x10);
                    pcVar19 = "*";
                    if ((*(uint *)((long)__ptr + (long)pNode->Id * 4) >> ((uint)lVar17 & 0x1f) & 1)
                        == 0) {
                      pcVar19 = "";
                    }
                    printf("%d(%.2f)%s ",(double)(float)pAVar2->nObjCounts[lVar12 + -0x18],lVar12,
                           pcVar19);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < (pNode->vFanins).nSize);
                }
                pNtk_00 = (Abc_Ntk_t *)0xa;
                putchar(10);
              }
              if (1 < (int)uVar23) {
                ppvVar7 = vTimes->pArray;
                pvVar4 = *ppvVar7;
                pvVar15 = ppvVar7[1];
                pvVar14 = pvVar4;
                if ((float)pAVar2->nObjCounts[(long)*(int *)((long)pvVar15 + 0x10) + -0x18] <=
                    (float)pAVar2->nObjCounts[(long)*(int *)((long)pvVar4 + 0x10) + -0x18] &&
                    (float)pAVar2->nObjCounts[(long)*(int *)((long)pvVar4 + 0x10) + -0x18] !=
                    (float)pAVar2->nObjCounts[(long)*(int *)((long)pvVar15 + 0x10) + -0x18]) {
                  *ppvVar7 = pvVar15;
                  ppvVar7[1] = pvVar4;
                  pvVar14 = pvVar15;
                  pvVar15 = pvVar4;
                }
                pNtk_00 = pAVar2;
                if (uVar23 != 2) {
                  pvVar4 = ppvVar7[2];
                  fVar25 = (float)pAVar2->nObjCounts[(long)*(int *)((long)pvVar15 + 0x10) + -0x18];
                  fVar1 = (float)pAVar2->nObjCounts[(long)*(int *)((long)pvVar4 + 0x10) + -0x18];
                  if (fVar1 < fVar25) {
                    ppvVar7[1] = pvVar4;
                    ppvVar7[2] = pvVar15;
                    pvVar15 = pvVar4;
                    fVar25 = fVar1;
                  }
                  if (fVar25 < (float)pAVar2->nObjCounts
                                      [(long)*(int *)((long)pvVar14 + 0x10) + -0x18]) {
                    *ppvVar7 = pvVar15;
                    ppvVar7[1] = pvVar14;
                  }
                }
              }
              local_90 = local_90 + 1;
              Abc_NtkSpeedupNode(pNtk_00,pAig,pNode,(Vec_Ptr_t *)vLeaves,vTimes);
            }
          }
        }
      }
      lVar24 = lVar24 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar24 < pVVar10->nSize);
    uVar9 = (ulong)uVar22;
    ppvVar7 = vTimes->pArray;
  }
  if (ppvVar7 != (void **)0x0) {
    free(ppvVar7);
  }
  free(vTimes);
  if ((void **)vLeaves->pName != (void **)0x0) {
    free(vLeaves->pName);
  }
  free(vLeaves);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (fVerbose != 0) {
    printf("Nodes: Total = %7d. Power-critical = %7d. Workable = %7d. Ratio = %4.2f\n",
           (double)local_90 / (double)(int)uVar9,(ulong)(uint)pNtk->nObjCounts[7],uVar9);
  }
  pVVar10 = pAig->vObjs;
  if (0 < pVVar10->nSize) {
    lVar24 = 0;
    do {
      puVar5 = (undefined8 *)pVVar10->pArray[lVar24];
      if (puVar5 != (undefined8 *)0x0) {
        if (((ulong)puVar5 & 1) != 0) {
          pcVar19 = "!Abc_ObjIsComplement(pNode)";
LAB_003147c7:
          __assert_fail(pcVar19,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar5 != 3) {
          pcVar19 = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_003147c7;
        }
        if (((*(int *)((long)puVar5 + 0x1c) == 2) && (puVar5[7] != 0)) &&
           (0 < *(int *)(puVar5[7] + 0x2c))) {
          puVar5[7] = 0;
          pVVar10 = pAig->vObjs;
        }
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < pVVar10->nSize);
  }
  if (vProbs->pArray != (int *)0x0) {
    free(vProbs->pArray);
  }
  free(vProbs);
  return pAig;
}

Assistant:

Abc_Ntk_t * Abc_NtkPowerdown( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Int_t * vProbs;
    Vec_Ptr_t * vTimeCries, * vTimeFanins;
    Abc_Obj_t * pNode, * pFanin, * pFanin2;
    float * pProb, Limit;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    unsigned * puPCEdges;
    // compute the limit
    Limit = 0.5 - (1.0 * Percentage / 100);
    // perform computation of switching probability
    vProbs = Abc_NtkPowerEstimate( pNtk, 0 );
    pProb = (float *)vProbs->pArray;
    // compute percentage of wires of each type
    if ( fVerbose )
        Abc_NtkPowerPrint( pNtk, vProbs );
    // mark the power critical nodes and edges
    puPCEdges = ABC_ALLOC( unsigned, Abc_NtkObjNumMax(pNtk) );
    memset( puPCEdges, 0, sizeof(unsigned) * Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pProb[pNode->Id] < Limit )
            continue;
        puPCEdges[pNode->Id] = Abc_NtkPowerCriticalEdges( pNtk, pNode, Limit, vProbs );
    }
/*
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Counter += Abc_ObjFaninNum(pNode);
            CounterRes += Extra_WordCountOnes( puPCEdges[pNode->Id] );
        }
        printf( "Edges: Total = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Counter, CounterRes, 1.0*CounterRes/Counter );
    }
*/
    // start the resulting network
    pNtkNew = Abc_NtkStrash( pNtk, 0, 1, 0 );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_PtrAlloc( 16 );
    vTimeFanins = Vec_PtrAlloc( 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( pProb[pNode->Id] < Limit )
//            continue;
        // count the number of non-PI power-critical nodes
        nTimeCris = 0;
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_ObjIsCi(pFanin) && (puPCEdges[pNode->Id] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of power-critical second-generation nodes
        Vec_PtrClear( vTimeCries );
        if ( nTimeCris )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && (puPCEdges[pNode->Id] & (1<<k)) )
                    Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                        if ( puPCEdges[pFanin->Id] & (1<<k2) )
                            Vec_PtrPushUnique( vTimeCries, pFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
        if ( (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_PtrClear( vTimeFanins );
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsCi(pFanin) )
                Vec_PtrPushUnique( vTimeFanins, pFanin );
            else
                Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                    Vec_PtrPushUnique( vTimeFanins, pFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, pNode->Id, 
            nTimeCris, Vec_PtrSize(vTimeCries), Vec_PtrSize(vTimeFanins) );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            printf( "%d(%.2f)%s ", pFanin->Id, pProb[pFanin->Id], (puPCEdges[pNode->Id] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_PtrSize(vTimeCries) > 1 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        if ( Vec_PtrSize(vTimeCries) > 2 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 2 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 2, pFanin );
            }
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        // add choice
        Abc_NtkSpeedupNode( pNtk, pNtkNew, pNode, vTimeFanins, vTimeCries );
    }
    Vec_PtrFree( vTimeCries );
    Vec_PtrFree( vTimeFanins );
    ABC_FREE( puPCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. Power-critical = %7d. Workable = %7d. Ratio = %4.2f\n", 
            Abc_NtkNodeNum(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter ); 

    // remove invalid choice nodes
    Abc_AigForEachAnd( pNtkNew, pNode, i )
        if ( pNode->pData )
        {
            if ( Abc_ObjFanoutNum((Abc_Obj_t *)pNode->pData) > 0 )
                pNode->pData = NULL;
        }

    // return the result
    Vec_IntFree( vProbs );
    return pNtkNew;
}